

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

UniquePtr<SSL_CTX> __thiscall
bssl::anon_unknown_0::CreateContextWithTestCertificate(anon_unknown_0 *this,SSL_METHOD *method)

{
  bool bVar1;
  int iVar2;
  pointer psVar3;
  X509 *x;
  EVP_PKEY *pkey;
  unique_ptr<evp_pkey_st,_bssl::internal::Deleter> local_40;
  UniquePtr<EVP_PKEY> key;
  unique_ptr<x509_st,_bssl::internal::Deleter> local_28;
  UniquePtr<X509> cert;
  UniquePtr<SSL_CTX> ctx;
  SSL_METHOD *method_local;
  
  psVar3 = (pointer)SSL_CTX_new((SSL_METHOD *)method);
  std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&cert,psVar3);
  GetTestCertificate();
  GetTestKey();
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&cert);
  if (((bVar1) && (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_28), bVar1))
     && (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_40), bVar1)) {
    psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&cert);
    x = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&local_28);
    iVar2 = SSL_CTX_use_certificate((SSL_CTX *)psVar3,x);
    if (iVar2 != 0) {
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&cert);
      pkey = (EVP_PKEY *)std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&local_40);
      iVar2 = SSL_CTX_use_PrivateKey((SSL_CTX *)psVar3,pkey);
      if (iVar2 != 0) {
        std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::unique_ptr
                  ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)this,
                   (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&cert);
        goto LAB_00187e0e;
      }
    }
  }
  std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
LAB_00187e0e:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&local_40);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&cert);
  return (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static bssl::UniquePtr<SSL_CTX> CreateContextWithTestCertificate(
    const SSL_METHOD *method) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(method));
  bssl::UniquePtr<X509> cert = GetTestCertificate();
  bssl::UniquePtr<EVP_PKEY> key = GetTestKey();
  if (!ctx || !cert || !key ||
      !SSL_CTX_use_certificate(ctx.get(), cert.get()) ||
      !SSL_CTX_use_PrivateKey(ctx.get(), key.get())) {
    return nullptr;
  }
  return ctx;
}